

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManCompute(If_DsdMan_t *p,word *pTruth,int nLeaves,uchar *pPerm,char *pLutStruct)

{
  word *pwVar1;
  word *pwVar2;
  FILE *pFile;
  int iVar3;
  int iVar4;
  int iVar5;
  word *pTruth_00;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  Vec_Ptr_t *p_00;
  int nSupp;
  uchar *local_a10;
  word pCopy [64];
  char pDsd [2000];
  
  nSupp = 0;
  uVar8 = (ulong)(uint)(1 << ((char)nLeaves - 6U & 0x1f));
  if (nLeaves < 7) {
    uVar8 = 1;
  }
  if (0xc < nLeaves) {
    __assert_fail("nLeaves <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x816,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  Abc_TtCopy(pCopy,pTruth,(int)uVar8,0);
  iVar3 = Dau_DsdDecompose(pCopy,nLeaves,0,1,pDsd);
  if (0 < iVar3) {
    Abc_TtStretch6(pCopy,iVar3,p->nVars);
  }
  memset(pPerm,0xff,(long)nLeaves);
  iVar3 = If_DsdManAddDsd(p,pDsd,pCopy,pPerm,&nSupp);
  if (nSupp != nLeaves) {
    __assert_fail("nSupp == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x821,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  local_a10 = pPerm;
  pTruth_00 = If_DsdManComputeTruth(p,iVar3,pPerm);
  uVar6 = 0;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  do {
    if (uVar8 == uVar6) goto LAB_0038b313;
    pwVar1 = pTruth_00 + uVar6;
    pwVar2 = pTruth + uVar6;
    uVar6 = uVar6 + 1;
  } while (*pwVar1 == *pwVar2);
  putchar(10);
  puts("Verification failed!");
  puts(pDsd);
  Dau_DsdPrintFromTruth(pTruth,nLeaves);
  Dau_DsdPrintFromTruth(pTruth_00,nLeaves);
  pFile = _stdout;
  iVar4 = Abc_Lit2Var(iVar3);
  If_DsdManPrintOne(pFile,p,iVar4,local_a10,1);
  putchar(10);
LAB_0038b313:
  p_00 = &p->vObjs;
  iVar4 = Abc_Lit2Var(iVar3);
  iVar5 = If_DsdVecObjRef(p_00,iVar4);
  if (iVar5 != 0x3ffff) {
    pvVar7 = Vec_PtrEntry(p_00,iVar4);
    *(uint *)((long)pvVar7 + 4) =
         *(uint *)((long)pvVar7 + 4) & 0xf80001ff | *(uint *)((long)pvVar7 + 4) + 0x200 & 0x7fffe00;
  }
  iVar4 = If_DsdVecLitSuppSize(p_00,iVar3);
  if (iVar4 == nLeaves) {
    return iVar3;
  }
  __assert_fail("If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                ,0x832,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)");
}

Assistant:

int If_DsdManCompute( If_DsdMan_t * p, word * pTruth, int nLeaves, unsigned char * pPerm, char * pLutStruct )
{
    word pCopy[DAU_MAX_WORD], * pRes;
    char pDsd[DAU_MAX_STR];
    int iDsd, nSizeNonDec, nSupp = 0;
    int nWords = Abc_TtWordNum(nLeaves);
//    abctime clk = 0;
    assert( nLeaves <= DAU_MAX_VAR );
    Abc_TtCopy( pCopy, pTruth, nWords, 0 );
//clk = Abc_Clock();
    nSizeNonDec = Dau_DsdDecompose( pCopy, nLeaves, 0, 1, pDsd );
//p->timeDsd += Abc_Clock() - clk;
    if ( nSizeNonDec > 0 )
        Abc_TtStretch6( pCopy, nSizeNonDec, p->nVars );
    memset( pPerm, 0xFF, (size_t)nLeaves );
//clk = Abc_Clock();
    iDsd = If_DsdManAddDsd( p, pDsd, pCopy, pPerm, &nSupp );
//p->timeCanon += Abc_Clock() - clk;
    assert( nSupp == nLeaves );
    // verify the result
//clk = Abc_Clock();
    pRes = If_DsdManComputeTruth( p, iDsd, pPerm );
//p->timeVerify += Abc_Clock() - clk;
    if ( !Abc_TtEqual(pRes, pTruth, nWords) )
    {
//        If_DsdManPrint( p, NULL );
        printf( "\n" );
        printf( "Verification failed!\n" );
        printf( "%s\n", pDsd );
        Dau_DsdPrintFromTruth( pTruth, nLeaves );
        Dau_DsdPrintFromTruth( pRes, nLeaves );
        If_DsdManPrintOne( stdout, p, Abc_Lit2Var(iDsd), pPerm, 1 );
        printf( "\n" );
    }
    If_DsdVecObjIncRef( &p->vObjs, Abc_Lit2Var(iDsd) );
    assert( If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves );
    return iDsd;
}